

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O0

void __thiscall isotropic::isotropic(isotropic *this,color *albedo)

{
  vec3 local_28;
  color *albedo_local;
  isotropic *this_local;
  
  local_28.e[2] = (double)albedo;
  albedo_local = (color *)this;
  material::material(&this->super_material);
  (this->super_material)._vptr_material = (_func_int **)&PTR__isotropic_0014cd60;
  std::make_shared<solid_color,vec3_const&>(&local_28);
  std::shared_ptr<texture>::shared_ptr<solid_color,void>
            (&this->tex,(shared_ptr<solid_color> *)&local_28);
  std::shared_ptr<solid_color>::~shared_ptr((shared_ptr<solid_color> *)&local_28);
  return;
}

Assistant:

isotropic(const color& albedo) : tex(make_shared<solid_color>(albedo)) {}